

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_per_ifetch(CPUS390XState_conflict *env,uint64_t addr)

{
  ulong uVar1;
  ulong uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint32_t uVar8;
  bool bVar9;
  CPUS390XState_conflict *__mptr;
  
  uVar7 = (uint)env->cregs[9];
  if ((uVar7 >> 0x1e & 1) != 0) {
    uVar1 = env->cregs[10];
    uVar2 = env->cregs[0xb];
    if (uVar2 < uVar1) {
      bVar9 = uVar1 <= addr || addr <= uVar2;
    }
    else {
      bVar9 = uVar1 <= addr && addr <= uVar2;
    }
    if (bVar9) {
      env->per_address = addr;
      uVar1 = (env->psw).mask;
      uVar5 = (ushort)(uVar1 >> 0x19) & 0x80;
      uVar6 = (ushort)(uVar1 >> 0x1a);
      uVar4 = (ushort)(uVar1 >> 0x36) & 0x10;
      uVar3 = (ushort)(uint)(uVar1 >> 0x2c) & 0xc;
      env->per_perc_atmid = uVar3 + (uVar4 | uVar6 & 0x20 | uVar5) + 0x4040;
      if ((uVar7 >> 0x18 & 1) != 0) {
        env->per_perc_atmid = uVar4 | uVar6 & 0x20 | uVar5 | uVar3 | 0x4140;
        env->int_pgm_code = 0x80;
        uVar8 = cpu_ldub_code_s390x(env,addr);
        uVar8 = get_ilen((uint8_t)uVar8);
        env->int_pgm_ilen = uVar8;
        *(undefined4 *)(env[-3].gscb + 2) = 3;
        cpu_loop_exit_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
      }
    }
  }
  return;
}

Assistant:

void HELPER(per_ifetch)(CPUS390XState *env, uint64_t addr)
{
    if ((env->cregs[9] & PER_CR9_EVENT_IFETCH) && get_per_in_range(env, addr)) {
        env->per_address = addr;
        env->per_perc_atmid = PER_CODE_EVENT_IFETCH | get_per_atmid(env);

        /* If the instruction has to be nullified, trigger the
           exception immediately. */
        if (env->cregs[9] & PER_CR9_EVENT_NULLIFICATION) {
            CPUState *cs = env_cpu(env);

            env->per_perc_atmid |= PER_CODE_EVENT_NULLIFICATION;
            env->int_pgm_code = PGM_PER;
            env->int_pgm_ilen = get_ilen(cpu_ldub_code(env, addr));

            cs->exception_index = EXCP_PGM;
            cpu_loop_exit(cs);
        }
    }
}